

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParseDocTypeDecl(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  xmlChar xVar5;
  __int32_t *p_Var6;
  internalSubsetSAXFunc p_Var7;
  bool bVar8;
  xmlParserErrors error;
  xmlChar *pxVar9;
  __int32_t **pp_Var10;
  xmlChar *pxVar11;
  byte *pbVar12;
  xmlChar *pxVar13;
  xmlParserInputPtr pxVar14;
  long lVar15;
  char *msg;
  int len;
  
  pxVar14 = ctxt->input;
  ppxVar1 = &pxVar14->cur;
  *ppxVar1 = *ppxVar1 + 9;
  piVar2 = &pxVar14->col;
  *piVar2 = *piVar2 + 9;
  htmlSkipBlankChars(ctxt);
  pxVar9 = htmlParseName(ctxt);
  if (pxVar9 == (xmlChar *)0x0) {
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseDocTypeDecl : no DOCTYPE name !\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
  }
  htmlSkipBlankChars(ctxt);
  pp_Var10 = __ctype_toupper_loc();
  p_Var6 = *pp_Var10;
  pxVar14 = ctxt->input;
  pbVar12 = pxVar14->cur;
  if (p_Var6[*pbVar12] == 0x50) {
    if ((((p_Var6[pbVar12[1]] != 0x55) || (p_Var6[pbVar12[2]] != 0x42)) ||
        (p_Var6[pbVar12[3]] != 0x4c)) ||
       ((p_Var6[pbVar12[4]] != 0x49 || (p_Var6[pbVar12[5]] != 0x43)))) goto LAB_0014b9c0;
    pxVar14->cur = pbVar12 + 6;
    pxVar14->col = pxVar14->col + 6;
    if ((0x20 < (ulong)pbVar12[6]) || ((0x100002600U >> ((ulong)pbVar12[6] & 0x3f) & 1) == 0)) {
      htmlParseErr(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'PUBLIC\'\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    htmlSkipBlankChars(ctxt);
    bVar3 = *ctxt->input->cur;
    if ((bVar3 == 0x22) || (bVar3 == 0x27)) {
      xmlNextChar(ctxt);
      pxVar14 = ctxt->input;
      pbVar12 = pxVar14->cur;
      lVar15 = (long)pbVar12 - (long)pxVar14->base;
      if (pbVar12 < pxVar14->base) goto LAB_0014bb2b;
      len = 0;
      bVar8 = false;
      while( true ) {
        bVar4 = *pbVar12;
        if ((bVar4 == 0) || (bVar4 == bVar3)) break;
        if (""[(long)(ulong)bVar4] == '\0') {
          htmlParseErrInt(ctxt,0x1eba0c,(char *)(ulong)bVar4,(int)pxVar14);
          bVar8 = true;
        }
        len = len + 1;
        xmlNextChar(ctxt);
        pbVar12 = ctxt->input->cur;
      }
      if (bVar4 != 0x22) {
        msg = "Unfinished PubidLiteral\n";
        error = XML_ERR_LITERAL_NOT_FINISHED;
        goto LAB_0014bb1d;
      }
      xmlNextChar(ctxt);
      if ((bVar8) ||
         (pxVar13 = xmlStrndup(ctxt->input->base + lVar15,len), pxVar13 == (xmlChar *)0x0))
      goto LAB_0014bb2b;
    }
    else {
      msg = "PubidLiteral \" or \' expected\n";
      error = XML_ERR_LITERAL_NOT_STARTED;
LAB_0014bb1d:
      htmlParseErr(ctxt,error,msg,(xmlChar *)0x0,(xmlChar *)0x0);
LAB_0014bb2b:
      pxVar13 = (xmlChar *)0x0;
      htmlParseErr(ctxt,XML_ERR_PUBID_REQUIRED,"htmlParseExternalID: PUBLIC, no Public Identifier\n"
                   ,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    htmlSkipBlankChars(ctxt);
    xVar5 = *ctxt->input->cur;
    if ((xVar5 == '\'') || (xVar5 == '\"')) {
      pxVar11 = htmlParseSystemLiteral(ctxt);
      goto LAB_0014b9c6;
    }
  }
  else if ((((p_Var6[*pbVar12] == 0x53) && (p_Var6[pbVar12[1]] == 0x59)) &&
           (p_Var6[pbVar12[2]] == 0x53)) &&
          (((p_Var6[pbVar12[3]] == 0x54 && (p_Var6[pbVar12[4]] == 0x45)) &&
           (p_Var6[pbVar12[5]] == 0x4d)))) {
    pxVar14->cur = pbVar12 + 6;
    pxVar14->col = pxVar14->col + 6;
    if ((0x20 < (ulong)pbVar12[6]) || ((0x100002600U >> ((ulong)pbVar12[6] & 0x3f) & 1) == 0)) {
      htmlParseErr(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'SYSTEM\'\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    htmlSkipBlankChars(ctxt);
    pxVar11 = htmlParseSystemLiteral(ctxt);
    if (pxVar11 != (xmlChar *)0x0) {
      pxVar13 = (xmlChar *)0x0;
      goto LAB_0014b9c6;
    }
    pxVar13 = (xmlChar *)0x0;
    htmlParseErr(ctxt,XML_ERR_URI_REQUIRED,"htmlParseExternalID: SYSTEM, no URI\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else {
LAB_0014b9c0:
    pxVar13 = (xmlChar *)0x0;
  }
  pxVar11 = (xmlChar *)0x0;
LAB_0014b9c6:
  htmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur == '>') {
LAB_0014b9db:
    xmlNextChar(ctxt);
  }
  else {
    htmlParseErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,"DOCTYPE improperly terminated\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    while (xVar5 = *ctxt->input->cur, xVar5 != '\0') {
      if (xVar5 == '>') goto LAB_0014b9db;
      xmlNextChar(ctxt);
    }
  }
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var7 = ctxt->sax->internalSubset, p_Var7 != (internalSubsetSAXFunc)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var7)(ctxt->userData,pxVar9,pxVar13,pxVar11);
  }
  if (pxVar11 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar11);
  }
  if (pxVar13 == (xmlChar *)0x0) {
    return;
  }
  (*xmlFree)(pxVar13);
  return;
}

Assistant:

static void
htmlParseDocTypeDecl(htmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP(9);

    SKIP_BLANKS;

    /*
     * Parse the DOCTYPE name.
     */
    name = htmlParseName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "htmlParseDocTypeDecl : no DOCTYPE name !\n",
		     NULL, NULL);
    }
    /*
     * Check that upper(name) == "HTML" !!!!!!!!!!!!!
     */

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = htmlParseExternalID(ctxt, &ExternalID);
    SKIP_BLANKS;

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (CUR != '>') {
	htmlParseErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED,
	             "DOCTYPE improperly terminated\n", NULL, NULL);
        /* Ignore bogus content */
        while ((CUR != 0) && (CUR != '>'))
            NEXT;
    }
    if (CUR == '>')
        NEXT;

    /*
     * Create or update the document accordingly to the DOCTYPE
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);

    /*
     * Cleanup, since we don't use all those identifiers
     */
    if (URI != NULL) xmlFree(URI);
    if (ExternalID != NULL) xmlFree(ExternalID);
}